

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O3

void __thiscall Clasp::Cli::JsonOutput::visitLogicProgramStats(JsonOutput *this,LpStats *lp)

{
  uint32 uVar1;
  char *pcVar2;
  uint32 i;
  int k;
  long lVar3;
  
  pushObject(this,"LP",type_object,false);
  pushObject(this,"Rules",type_object,false);
  uVar1 = Asp::RuleStats::sum(lp->rules);
  printf("%s%-*s\"%s\": %lu",this->open_,(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
         " ","Original",(ulong)uVar1);
  this->open_ = ",\n";
  uVar1 = Asp::RuleStats::sum(lp->rules + 1);
  printf("%s%-*s\"%s\": %lu",this->open_,(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
         " ","Final",(ulong)uVar1);
  this->open_ = ",\n";
  lVar3 = 0;
  do {
    k = (int)lVar3;
    if (k != 0) {
      if (k == 5) break;
      if (lp->rules[0].key[lVar3] != 0) {
        pcVar2 = Asp::RuleStats::toStr(k);
        pushObject(this,pcVar2,type_object,false);
        printf("%s%-*s\"%s\": %lu",this->open_,
               (ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ","Original",
               (ulong)lp->rules[0].key[lVar3]);
        this->open_ = ",\n";
        printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
               " ","Final",(ulong)lp->rules[1].key[lVar3]);
        this->open_ = ",\n";
        popObject(this);
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
  popObject(this);
  printf("%s%-*s\"%s\": %lu",this->open_,(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
         " ","Atoms",(ulong)lp->atoms);
  this->open_ = ",\n";
  if (lp->auxAtoms != 0) {
    printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ",
           "AuxAtoms");
    this->open_ = ",\n";
  }
  if (lp->disjunctions[0] != 0) {
    pushObject(this,"Disjunctions",type_object,false);
    printf("%s%-*s\"%s\": %lu",this->open_,
           (ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ","Original",
           (ulong)lp->disjunctions[0]);
    this->open_ = ",\n";
    printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ",
           "Final",(ulong)lp->disjunctions[1]);
    this->open_ = ",\n";
    popObject(this);
  }
  pushObject(this,"Bodies",type_object,false);
  uVar1 = Asp::BodyStats::sum(lp->bodies);
  printf("%s%-*s\"%s\": %lu",this->open_,(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
         " ","Original",(ulong)uVar1);
  this->open_ = ",\n";
  uVar1 = Asp::BodyStats::sum(lp->bodies + 1);
  printf("%s%-*s\"%s\": %lu",this->open_,(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
         " ","Final",(ulong)uVar1);
  this->open_ = ",\n";
  lVar3 = 0;
  do {
    if (lp->disjunctions[lVar3 + -7] != 0) {
      pcVar2 = Asp::BodyStats::toStr((int)lVar3 + 1);
      pushObject(this,pcVar2,type_object,false);
      printf("%s%-*s\"%s\": %lu",this->open_,
             (ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ","Original",
             (ulong)lp->disjunctions[lVar3 + -7]);
      this->open_ = ",\n";
      printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
             " ","Final",(ulong)lp->disjunctions[lVar3 + -4]);
      this->open_ = ",\n";
      popObject(this);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  popObject(this);
  if (lp->sccs == 0) {
    pcVar2 = "yes";
  }
  else {
    if (lp->sccs != 0x7ffffff) {
      printKeyValue(this,"Tight","no");
      printf("%s%-*s\"%s\": %lu",this->open_,
             (ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ","SCCs",(ulong)lp->sccs);
      this->open_ = ",\n";
      printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
             " ","NonHcfs",(ulong)lp->nonHcfs);
      this->open_ = ",\n";
      printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
             " ","UfsNodes",(ulong)lp->ufsNodes);
      this->open_ = ",\n";
      printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
             " ","NonHcfGammas",(ulong)lp->gammas);
      this->open_ = ",\n";
      goto LAB_0012e0dd;
    }
    pcVar2 = "N/A";
  }
  printKeyValue(this,"Tight",pcVar2);
LAB_0012e0dd:
  pushObject(this,"Equivalences",type_object,false);
  printf("%s%-*s\"%s\": %lu",this->open_,(ulong)(uint)((int)(this->objStack_)._M_string_length * 2),
         " ","Sum",(ulong)(lp->eqs_[1] + lp->eqs_[0] + lp->eqs_[2]));
  this->open_ = ",\n";
  printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ",
         "Atom",(ulong)lp->eqs_[0]);
  this->open_ = ",\n";
  printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ",
         "Body",(ulong)lp->eqs_[1]);
  this->open_ = ",\n";
  printf("%s%-*s\"%s\": %lu",",\n",(ulong)(uint)((int)(this->objStack_)._M_string_length * 2)," ",
         "Other",(ulong)lp->eqs_[2]);
  this->open_ = ",\n";
  popObject(this);
  popObject(this);
  return;
}

Assistant:

void JsonOutput::visitLogicProgramStats(const Asp::LpStats& lp) {
	using namespace Asp;
	pushObject("LP");
	pushObject("Rules");
	printKeyValue("Original", lp.rules[0].sum());
	printKeyValue("Final",    lp.rules[1].sum());
	for (uint32 i = 0; i != RuleStats::numKeys(); ++i) {
		if (i != RuleStats::Normal && lp.rules[0][i]) {
			pushObject(RuleStats::toStr(i));
			printKeyValue("Original", lp.rules[0][i]);
			printKeyValue("Final",    lp.rules[1][i]);
			popObject();
		}
	}
	popObject(); // Rules
	printKeyValue("Atoms", lp.atoms);
	if (lp.auxAtoms) { printKeyValue("AuxAtoms", lp.auxAtoms); }
	if (lp.disjunctions[0]) {
		pushObject("Disjunctions");
		printKeyValue("Original", lp.disjunctions[0]);
		printKeyValue("Final", lp.disjunctions[1]);
		popObject();
	}
	pushObject("Bodies");
	printKeyValue("Original", lp.bodies[0].sum());
	printKeyValue("Final"   , lp.bodies[1].sum());
	for (uint32 i = 1; i != BodyStats::numKeys(); ++i) {
		if (lp.bodies[0][i]) {
			pushObject(BodyStats::toStr(i));
			printKeyValue("Original", lp.bodies[0][i]);
			printKeyValue("Final",    lp.bodies[1][i]);
			popObject();
		}
	}
	popObject();
	if      (lp.sccs == 0)              { printKeyValue("Tight", "yes"); }
	else if (lp.sccs == PrgNode::noScc) { printKeyValue("Tight", "N/A"); }
	else                                {
		printKeyValue("Tight", "no");
		printKeyValue("SCCs", lp.sccs);
		printKeyValue("NonHcfs", lp.nonHcfs);
		printKeyValue("UfsNodes", lp.ufsNodes);
		printKeyValue("NonHcfGammas", lp.gammas);
	}
	pushObject("Equivalences");
	printKeyValue("Sum", lp.eqs());
	printKeyValue("Atom", lp.eqs(Var_t::Atom));
	printKeyValue("Body", lp.eqs(Var_t::Body));
	printKeyValue("Other", lp.eqs(Var_t::Hybrid));
	popObject();
	popObject(); // LP
}